

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O0

void Wln_ObjAddFanin(Wln_Ntk_t *p,int iObj,int i)

{
  int iVar1;
  Wln_Vec_t *pWVar2;
  int *piVar3;
  int *local_30;
  int *pArray;
  Wln_Vec_t *pVec;
  int i_local;
  int iObj_local;
  Wln_Ntk_t *p_local;
  
  pWVar2 = p->vFanins + iObj;
  iVar1 = Wln_ObjFaninNum(p,iObj);
  if (iVar1 < 2) {
    iVar1 = pWVar2->nSize;
    pWVar2->nSize = iVar1 + 1;
    *(int *)((long)&pWVar2->field_2 + (long)iVar1 * 4) = i;
  }
  else {
    iVar1 = Wln_ObjFaninNum(p,iObj);
    if (iVar1 == 2) {
      piVar3 = (int *)malloc(0x10);
      *piVar3 = (pWVar2->field_2).Array[0];
      piVar3[1] = (pWVar2->field_2).Array[1];
      piVar3[2] = i;
      (pWVar2->field_2).pArray[0] = piVar3;
      pWVar2->nSize = 3;
      pWVar2->nCap = 4;
    }
    else {
      if (pWVar2->nSize == pWVar2->nCap) {
        if ((pWVar2->field_2).pArray[0] == (int *)0x0) {
          iVar1 = pWVar2->nSize << 1;
          pWVar2->nCap = iVar1;
          local_30 = (int *)malloc((long)iVar1 << 2);
        }
        else {
          iVar1 = pWVar2->nSize << 1;
          pWVar2->nCap = iVar1;
          local_30 = (int *)realloc((pWVar2->field_2).pArray[0],(long)iVar1 << 2);
        }
        (pWVar2->field_2).pArray[0] = local_30;
      }
      if (pWVar2->nCap <= pWVar2->nSize) {
        __assert_fail("pVec->nSize < pVec->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                      ,0x5e,"void Wln_ObjAddFanin(Wln_Ntk_t *, int, int)");
      }
      iVar1 = pWVar2->nSize;
      pWVar2->nSize = iVar1 + 1;
      (pWVar2->field_2).pArray[0][iVar1] = i;
    }
  }
  return;
}

Assistant:

void Wln_ObjAddFanin( Wln_Ntk_t * p, int iObj, int i )        
{ 
    Wln_Vec_t * pVec = p->vFanins + iObj;
    if ( Wln_ObjFaninNum(p, iObj) < 2 )
        pVec->Array[pVec->nSize++] = i;
    else if ( Wln_ObjFaninNum(p, iObj) == 2 )
    {
        int * pArray = ABC_ALLOC( int, 4 );
        pArray[0] = pVec->Array[0];
        pArray[1] = pVec->Array[1];
        pArray[2] = i;
        pVec->pArray[0] = pArray;
        pVec->nSize     = 3;
        pVec->nCap      = 4;
    }
    else 
    {
        if ( pVec->nSize == pVec->nCap )
            pVec->pArray[0] = ABC_REALLOC( int, pVec->pArray[0], (pVec->nCap = 2*pVec->nSize) ); 
        assert( pVec->nSize < pVec->nCap );
        pVec->pArray[0][pVec->nSize++] = i;
    }
}